

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PushUnknown(XMLPrinter *this,char *value)

{
  XMLPrinter *in_RSI;
  long *in_RDI;
  XMLPrinter *unaff_retaddr;
  long *data;
  
  data = in_RDI;
  SealElementIfJustOpened(in_RSI);
  if (((*(int *)((long)in_RDI + 0x84) < 0) && ((*(byte *)(in_RDI + 0xe) & 1) == 0)) &&
     ((*(byte *)((long)in_RDI + 0x89) & 1) == 0)) {
    Putc(unaff_retaddr,(char)((ulong)data >> 0x38));
    (**(code **)(*in_RDI + 0x60))(in_RDI,(int)in_RDI[0x10]);
  }
  *(undefined1 *)(in_RDI + 0xe) = 0;
  Write(unaff_retaddr,(char *)data);
  Write(unaff_retaddr,(char *)data);
  Putc(unaff_retaddr,(char)((ulong)data >> 0x38));
  return;
}

Assistant:

void XMLPrinter::PushUnknown( const char* value )
{
    SealElementIfJustOpened();
    if ( _textDepth < 0 && !_firstElement && !_compactMode) {
        Putc( '\n' );
        PrintSpace( _depth );
    }
    _firstElement = false;

    Write( "<!" );
    Write( value );
    Putc( '>' );
}